

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O3

void secp256k1_fe_cmov(secp256k1_fe *r,secp256k1_fe *a,int flag)

{
  secp256k1_fe *r_00;
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  undefined8 a_00;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  secp256k1_gej *psVar14;
  secp256k1_gej *a_01;
  secp256k1_gej *a_02;
  secp256k1_modinv64_modinfo *modinfo;
  secp256k1_gej *psVar15;
  secp256k1_gej *psVar16;
  secp256k1_gej *a_03;
  ulong uVar17;
  uint64_t *puVar18;
  uint64_t *puVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  secp256k1_gej *psVar24;
  undefined1 *unaff_R13;
  ulong uVar25;
  ulong uVar26;
  undefined1 *puVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  int vflag;
  unsigned_long _zzq_result;
  unsigned_long _zzq_args [6];
  secp256k1_gej *psStack_308;
  ulong uStack_2f8;
  uint64_t uStack_2f0;
  ulong uStack_2e8;
  ulong uStack_2e0;
  uint64_t uStack_2d0;
  ulong uStack_2c8;
  uint64_t uStack_2c0;
  undefined1 auStack_2b0 [48];
  ulong uStack_280;
  ulong uStack_278;
  ulong uStack_270;
  secp256k1_gej *psStack_268;
  undefined1 auStack_260 [56];
  ulong uStack_228;
  ulong uStack_220;
  secp256k1_gej *psStack_218;
  undefined1 auStack_210 [96];
  secp256k1_gej *psStack_1b0;
  undefined1 *puStack_1a8;
  secp256k1_gej *psStack_1a0;
  undefined1 *puStack_198;
  code *pcStack_190;
  secp256k1_gej *psStack_188;
  secp256k1_gej *psStack_178;
  undefined1 auStack_168 [152];
  undefined8 uStack_d0;
  secp256k1_fe sStack_a8;
  
  if ((uint)flag < 2) {
    secp256k1_fe_verify(a);
    secp256k1_fe_verify(r);
    uVar7 = (long)flag - 1;
    uVar6 = -(long)flag;
    r->n[0] = a->n[0] & uVar6 | r->n[0] & uVar7;
    r->n[1] = a->n[1] & uVar6 | r->n[1] & uVar7;
    r->n[2] = a->n[2] & uVar6 | r->n[2] & uVar7;
    r->n[3] = a->n[3] & uVar6 | r->n[3] & uVar7;
    r->n[4] = uVar6 & a->n[4] | uVar7 & r->n[4];
    if (r->magnitude < a->magnitude) {
      r->magnitude = a->magnitude;
    }
    if (a->normalized == 0) {
      r->normalized = 0;
    }
    secp256k1_fe_verify(r);
    return;
  }
  secp256k1_fe_cmov_cold_1();
  psVar24 = (secp256k1_gej *)0x1000003d0;
  secp256k1_gej_verify((secp256k1_gej *)r);
  secp256k1_fe_verify(a);
  secp256k1_fe_verify(a);
  uVar7 = (a->n[4] >> 0x30) * 0x1000003d1 + a->n[0];
  if (((uVar7 & 0xfffffffffffff) != 0xffffefffffc2f) && ((uVar7 & 0xfffffffffffff) != 0)) {
LAB_001442cf:
    secp256k1_fe_sqr(&sStack_a8,a);
    secp256k1_fe_mul(r,r,&sStack_a8);
    r_00 = &((secp256k1_gej *)r)->y;
    secp256k1_fe_mul(r_00,r_00,&sStack_a8);
    secp256k1_fe_mul(r_00,r_00,a);
    secp256k1_fe_mul(&((secp256k1_gej *)r)->z,&((secp256k1_gej *)r)->z,a);
    secp256k1_gej_verify((secp256k1_gej *)r);
    return;
  }
  uVar6 = (uVar7 >> 0x34) + a->n[1];
  psVar14 = (secp256k1_gej *)((uVar6 >> 0x34) + a->n[2]);
  psVar15 = (secp256k1_gej *)(((ulong)psVar14 >> 0x34) + a->n[3]);
  uVar17 = ((ulong)psVar15 >> 0x34) + (a->n[4] & 0xffffffffffff);
  if ((((uVar6 | uVar7 | (ulong)psVar14 | (ulong)psVar15) & 0xfffffffffffff) != 0 || uVar17 != 0) &&
     (((uVar7 | 0x1000003d0) & uVar6 & (ulong)psVar14 & (ulong)psVar15 & (uVar17 ^ 0xf000000000000))
      != 0xfffffffffffff)) goto LAB_001442cf;
  secp256k1_gej_rescale_cold_1();
  uStack_d0 = 0x1000003d0;
  a_02 = (secp256k1_gej *)auStack_168;
  a_03 = (secp256k1_gej *)auStack_168;
  puVar27 = auStack_168;
  auStack_168._144_8_ = r;
  secp256k1_gej_verify(psVar14);
  psVar15->infinity = psVar14->infinity;
  secp256k1_fe_mul(&psVar15->z,&psVar14->z,&psVar14->y);
  secp256k1_fe_sqr((secp256k1_fe *)auStack_168,&psVar14->y);
  psVar16 = (secp256k1_gej *)(auStack_168 + 0x60);
  a_01 = psVar14;
  secp256k1_fe_sqr((secp256k1_fe *)psVar16,&psVar14->x);
  secp256k1_fe_verify((secp256k1_fe *)psVar16);
  if ((int)auStack_168._136_4_ < 0xb) {
    auStack_168._136_4_ = auStack_168._136_4_ * 3;
    a_01 = (secp256k1_gej *)(auStack_168 + 0x60);
    auStack_168._96_8_ = auStack_168._96_8_ * 3;
    auStack_168._104_8_ = auStack_168._104_8_ * 3;
    auStack_168._112_8_ = auStack_168._112_8_ * 3;
    auStack_168._120_8_ = auStack_168._120_8_ * 3;
    auStack_168._128_8_ = auStack_168._128_8_ * 3;
    auStack_168._140_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)a_01);
    secp256k1_fe_half((secp256k1_fe *)a_01);
    secp256k1_fe_verify((secp256k1_fe *)auStack_168);
    secp256k1_fe_verify_magnitude((secp256k1_fe *)auStack_168,1);
    auStack_168._48_8_ = 0x3ffffbfffff0bc - auStack_168._0_8_;
    auStack_168._56_8_ = 0x3ffffffffffffc - auStack_168._8_8_;
    psVar24 = (secp256k1_gej *)(auStack_168 + 0x30);
    auStack_168._64_8_ = 0x3ffffffffffffc - auStack_168._16_8_;
    auStack_168._72_8_ = 0x3ffffffffffffc - auStack_168._24_8_;
    auStack_168._80_8_ = 0x3fffffffffffc - auStack_168._32_8_;
    auStack_168._88_8_ = 2;
    secp256k1_fe_verify((secp256k1_fe *)psVar24);
    secp256k1_fe_mul((secp256k1_fe *)psVar24,(secp256k1_fe *)psVar24,&psVar14->x);
    secp256k1_fe_sqr(&psVar15->x,(secp256k1_fe *)a_01);
    secp256k1_fe_verify(&psVar15->x);
    psVar16 = psVar24;
    secp256k1_fe_verify((secp256k1_fe *)psVar24);
    iVar4 = auStack_168._88_4_ + (psVar15->x).magnitude;
    unaff_R13 = auStack_168;
    if (0x20 < iVar4) goto LAB_0014469b;
    uVar1 = (psVar15->x).n[1];
    uVar2 = (psVar15->x).n[2];
    uVar3 = (psVar15->x).n[3];
    psVar14 = (secp256k1_gej *)(auStack_168 + 0x30);
    (psVar15->x).n[0] = (psVar15->x).n[0] + auStack_168._48_8_;
    (psVar15->x).n[1] = uVar1 + auStack_168._56_8_;
    (psVar15->x).n[2] = uVar2 + auStack_168._64_8_;
    (psVar15->x).n[3] = uVar3 + auStack_168._72_8_;
    puVar18 = (psVar15->x).n + 4;
    *puVar18 = *puVar18 + auStack_168._80_8_;
    (psVar15->x).magnitude = iVar4;
    (psVar15->x).normalized = 0;
    secp256k1_fe_verify(&psVar15->x);
    secp256k1_fe_verify(&psVar15->x);
    psVar16 = psVar14;
    secp256k1_fe_verify((secp256k1_fe *)psVar14);
    iVar4 = auStack_168._88_4_ + (psVar15->x).magnitude;
    unaff_R13 = auStack_168;
    if (0x20 < iVar4) goto LAB_001446a0;
    uVar1 = (psVar15->x).n[1];
    uVar2 = (psVar15->x).n[2];
    uVar3 = (psVar15->x).n[3];
    psVar14 = (secp256k1_gej *)(auStack_168 + 0x30);
    (psVar15->x).n[0] = (psVar15->x).n[0] + auStack_168._48_8_;
    (psVar15->x).n[1] = uVar1 + auStack_168._56_8_;
    (psVar15->x).n[2] = uVar2 + auStack_168._64_8_;
    (psVar15->x).n[3] = uVar3 + auStack_168._72_8_;
    puVar18 = (psVar15->x).n + 4;
    *puVar18 = *puVar18 + auStack_168._80_8_;
    (psVar15->x).magnitude = iVar4;
    (psVar15->x).normalized = 0;
    secp256k1_fe_verify(&psVar15->x);
    secp256k1_fe_sqr((secp256k1_fe *)auStack_168,(secp256k1_fe *)auStack_168);
    secp256k1_fe_verify((secp256k1_fe *)psVar14);
    psVar16 = psVar15;
    secp256k1_fe_verify(&psVar15->x);
    uVar5 = (psVar15->x).magnitude + auStack_168._88_4_;
    unaff_R13 = auStack_168;
    if (0x20 < (int)uVar5) goto LAB_001446a5;
    a_02 = (secp256k1_gej *)(auStack_168 + 0x30);
    auStack_168._48_8_ = (psVar15->x).n[0] + auStack_168._48_8_;
    auStack_168._56_8_ = (psVar15->x).n[1] + auStack_168._56_8_;
    auStack_168._64_8_ = (psVar15->x).n[2] + auStack_168._64_8_;
    auStack_168._72_8_ = (psVar15->x).n[3] + auStack_168._72_8_;
    auStack_168._80_8_ = auStack_168._80_8_ + (psVar15->x).n[4];
    auStack_168._92_4_ = 0;
    auStack_168._88_4_ = uVar5;
    secp256k1_fe_verify((secp256k1_fe *)a_02);
    psVar14 = (secp256k1_gej *)&psVar15->y;
    secp256k1_fe_mul((secp256k1_fe *)psVar14,(secp256k1_fe *)a_02,
                     (secp256k1_fe *)(auStack_168 + 0x60));
    secp256k1_fe_verify((secp256k1_fe *)psVar14);
    secp256k1_fe_verify((secp256k1_fe *)auStack_168);
    iVar4 = auStack_168._40_4_ + (psVar15->y).magnitude;
    unaff_R13 = auStack_168;
    if (iVar4 < 0x21) {
      uVar1 = (psVar15->y).n[1];
      uVar2 = (psVar15->y).n[2];
      uVar3 = (psVar15->y).n[3];
      (psVar15->y).n[0] = (psVar15->y).n[0] + auStack_168._0_8_;
      (psVar15->y).n[1] = uVar1 + auStack_168._8_8_;
      (psVar15->y).n[2] = uVar2 + auStack_168._16_8_;
      (psVar15->y).n[3] = uVar3 + auStack_168._24_8_;
      puVar18 = (psVar15->y).n + 4;
      *puVar18 = *puVar18 + auStack_168._32_8_;
      (psVar15->y).magnitude = iVar4;
      (psVar15->y).normalized = 0;
      secp256k1_fe_verify((secp256k1_fe *)psVar14);
      secp256k1_fe_verify((secp256k1_fe *)psVar14);
      secp256k1_fe_verify_magnitude((secp256k1_fe *)psVar14,2);
      uVar1 = (psVar15->y).n[1];
      uVar2 = (psVar15->y).n[2];
      uVar3 = (psVar15->y).n[3];
      (psVar15->y).n[0] = 0x5ffff9ffffe91a - (psVar15->y).n[0];
      (psVar15->y).n[1] = 0x5ffffffffffffa - uVar1;
      (psVar15->y).n[2] = 0x5ffffffffffffa - uVar2;
      (psVar15->y).n[3] = 0x5ffffffffffffa - uVar3;
      (psVar15->y).n[4] = 0x5fffffffffffa - (psVar15->y).n[4];
      (psVar15->y).magnitude = 3;
      (psVar15->y).normalized = 0;
      secp256k1_fe_verify((secp256k1_fe *)psVar14);
      secp256k1_gej_verify(psVar15);
      return;
    }
  }
  else {
    secp256k1_gej_double_cold_5();
LAB_0014469b:
    secp256k1_gej_double_cold_4();
LAB_001446a0:
    a_02 = a_01;
    secp256k1_gej_double_cold_3();
LAB_001446a5:
    a_03 = psVar16;
    puVar27 = auStack_168 + 0x60;
    secp256k1_gej_double_cold_2();
  }
  secp256k1_gej_double_cold_1();
  uVar7 = (ulong)a_02 & 0xffffffff;
  psStack_188 = (secp256k1_gej *)0x1446bc;
  psVar16 = a_03;
  psStack_178 = psVar15;
  secp256k1_fe_verify(&a_03->x);
  if ((uint)a_02 < 0x21) {
    iVar4 = (a_03->x).magnitude * (uint)a_02;
    if (iVar4 < 0x21) {
      (a_03->x).n[0] = (a_03->x).n[0] * uVar7;
      (a_03->x).n[1] = (a_03->x).n[1] * uVar7;
      (a_03->x).n[2] = (a_03->x).n[2] * uVar7;
      (a_03->x).n[3] = (a_03->x).n[3] * uVar7;
      (a_03->x).n[4] = uVar7 * (a_03->x).n[4];
      (a_03->x).magnitude = iVar4;
      (a_03->x).normalized = 0;
      secp256k1_fe_verify(&a_03->x);
      return;
    }
  }
  else {
    psStack_188 = (secp256k1_gej *)0x144722;
    secp256k1_fe_mul_int_unchecked_cold_2();
  }
  psStack_188 = (secp256k1_gej *)secp256k1_fe_half;
  secp256k1_fe_mul_int_unchecked_cold_1();
  pcStack_190 = (code *)0x144730;
  psStack_188 = a_03;
  secp256k1_fe_verify(&psVar16->x);
  pcStack_190 = (code *)0x14473d;
  psVar15 = psVar16;
  secp256k1_fe_verify_magnitude(&psVar16->x,0x1f);
  modinfo = (secp256k1_modinv64_modinfo *)(psVar16->x).n[0];
  uVar6 = -(ulong)((uint)modinfo & 1);
  uVar17 = uVar6 >> 0xc;
  uVar23 = (long)(modinfo->modulus).v + (uVar17 & 0xffffefffffc2f);
  if ((uVar23 & 1) == 0) {
    uVar7 = (uVar6 >> 0x10) + (psVar16->x).n[4];
    uVar10 = uVar17 + (psVar16->x).n[3];
    uVar5 = (uint)(uVar6 >> 0x2c);
    auVar29._0_8_ = CONCAT44(uVar5,(int)uVar17);
    auVar29._8_4_ = (int)uVar17;
    auVar29._12_4_ = uVar5;
    uVar6 = auVar29._0_8_ + (psVar16->x).n[1];
    uVar17 = auVar29._8_8_ + (psVar16->x).n[2];
    (psVar16->x).n[0] = ((ulong)((uint)uVar6 & 1) << 0x33) + (uVar23 >> 1);
    (psVar16->x).n[1] = ((uVar17 & 1) << 0x33) + (uVar6 >> 1);
    (psVar16->x).n[2] = ((uVar10 & 1) << 0x33) + (uVar17 >> 1);
    (psVar16->x).n[3] = ((ulong)((uint)uVar7 & 1) << 0x33) + (uVar10 >> 1);
    (psVar16->x).n[4] = uVar7 >> 1;
    (psVar16->x).magnitude = ((psVar16->x).magnitude >> 1) + 1;
    (psVar16->x).normalized = 0;
    secp256k1_fe_verify(&psVar16->x);
    return;
  }
  pcStack_190 = secp256k1_modinv64;
  secp256k1_fe_half_cold_1();
  uVar9 = 0;
  auStack_210._16_8_ = 0;
  auStack_210._24_8_ = 0;
  auStack_210._0_8_ = 0;
  auStack_210._8_8_ = 0;
  auStack_210._32_8_ = 0;
  auStack_210._72_8_ = 0;
  auStack_210._80_8_ = 0;
  auStack_210._56_8_ = 0;
  auStack_210._64_8_ = 0;
  auStack_210._48_8_ = 1;
  uStack_2f8 = (modinfo->modulus).v[4];
  uVar6 = (modinfo->modulus).v[0];
  uStack_2c8 = (modinfo->modulus).v[1];
  uStack_2e0 = (modinfo->modulus).v[2];
  uVar17 = (modinfo->modulus).v[3];
  auStack_260._0_8_ = (psVar15->x).n[0];
  uStack_2c0 = (psVar15->x).n[1];
  uStack_2d0 = (psVar15->x).n[2];
  uStack_2e8 = (psVar15->x).n[3];
  uStack_2f0 = (psVar15->x).n[4];
  uVar10 = 0xffffffffffffffff;
  uVar23 = auStack_260._0_8_;
  auStack_2b0._0_8_ = uVar6;
  auStack_2b0._8_8_ = uStack_2c8;
  auStack_2b0._16_8_ = uStack_2e0;
  auStack_2b0._24_8_ = uVar17;
  auStack_2b0._32_8_ = uStack_2f8;
  auStack_2b0._40_8_ = psVar15;
  auStack_260._8_8_ = uStack_2c0;
  auStack_260._16_8_ = uStack_2d0;
  auStack_260._24_8_ = uStack_2e8;
  auStack_260._32_8_ = uStack_2f0;
  auStack_210._88_8_ = psVar16;
  psStack_1b0 = psVar24;
  puStack_1a8 = unaff_R13;
  psStack_1a0 = psVar14;
  puStack_198 = puVar27;
  pcStack_190 = (code *)uVar7;
  do {
    uVar26 = 8;
    lVar11 = 3;
    uVar7 = 0;
    uVar25 = 0;
    psVar24 = (secp256k1_gej *)0x8;
    psStack_308 = (secp256k1_gej *)0x8;
    uVar8 = uVar23;
    uVar12 = uVar6;
    do {
      if ((uVar12 & 1) == 0) {
        secp256k1_modinv64_cold_29();
LAB_00145262:
        secp256k1_modinv64_cold_1();
LAB_00145267:
        secp256k1_modinv64_cold_2();
LAB_0014526c:
        secp256k1_modinv64_cold_28();
        goto LAB_00145271;
      }
      psVar15 = (secp256k1_gej *)(uVar7 * uVar23 + uVar26 * uVar6);
      psVar24 = (secp256k1_gej *)(uVar12 << ((byte)lVar11 & 0x3f));
      if (psVar15 != psVar24) goto LAB_00145262;
      psVar15 = (secp256k1_gej *)((long)psStack_308 * uVar23 + uVar25 * uVar6);
      psVar24 = (secp256k1_gej *)(uVar8 << ((byte)lVar11 & 0x3f));
      if (psVar15 != psVar24) goto LAB_00145267;
      psVar24 = (secp256k1_gej *)((long)uVar10 >> 0x3f);
      uStack_270 = (ulong)((uint)uVar8 & 1);
      uVar22 = -uStack_270;
      psVar15 = (secp256k1_gej *)((ulong)psVar24 & uVar22);
      psStack_268 = psVar24;
      if ((uVar10 ^ (ulong)psVar15) - 0x251 < 0xfffffffffffffb61) goto LAB_0014526c;
      uVar10 = (uVar10 ^ (ulong)psVar15) - 1;
      psStack_308 = (secp256k1_gej *)
                    ((long)(psStack_308->x).n + (((ulong)psVar24 ^ uVar7) - (long)psVar24 & uVar22))
      ;
      uVar7 = (uVar7 + ((ulong)psStack_308 & (ulong)psVar15)) * 2;
      uVar25 = uVar25 + (((ulong)psVar24 ^ uVar26) - (long)psVar24 & uVar22);
      uVar26 = (uVar26 + (uVar25 & (ulong)psVar15)) * 2;
      uVar22 = (((ulong)psVar24 ^ uVar12) - (long)psVar24 & uVar22) + uVar8;
      uVar8 = uVar22 >> 1;
      uVar12 = uVar12 + (uVar22 & (ulong)psVar15);
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x3e);
    psVar24 = (secp256k1_gej *)(uVar7 * uVar25);
    psVar15 = psStack_308;
    uStack_278 = uVar9;
    auStack_260._48_8_ = uVar26;
    uStack_228 = uVar7;
    uStack_220 = uVar25;
    psStack_218 = psStack_308;
    if ((SUB168(SEXT816((long)uVar26) * SEXT816((long)psStack_308),8) -
        SUB168(SEXT816((long)uVar7) * SEXT816((long)uVar25),8)) -
        (ulong)((secp256k1_gej *)(uVar26 * (long)psStack_308) < psVar24) != 2 ||
        (long)(uVar26 * (long)psStack_308) - (long)psVar24 != 0) goto LAB_001452e9;
    secp256k1_modinv64_update_de_62
              ((secp256k1_modinv64_signed62 *)auStack_210,
               (secp256k1_modinv64_signed62 *)(auStack_210 + 0x30),
               (secp256k1_modinv64_trans2x2 *)(auStack_260 + 0x30),modinfo);
    psVar14 = (secp256k1_gej *)auStack_2b0;
    psVar24 = (secp256k1_gej *)0x5;
    psVar15 = psVar14;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar14,5,&modinfo->modulus,-1);
    if (iVar4 < 1) {
LAB_00145271:
      psVar14 = psVar15;
      secp256k1_modinv64_cold_27();
LAB_00145276:
      secp256k1_modinv64_cold_26();
LAB_0014527b:
      psVar15 = psVar14;
      secp256k1_modinv64_cold_25();
LAB_00145280:
      secp256k1_modinv64_cold_24();
LAB_00145285:
      secp256k1_modinv64_cold_4();
LAB_0014528a:
      secp256k1_modinv64_cold_5();
LAB_0014528f:
      secp256k1_modinv64_cold_21();
LAB_00145294:
      secp256k1_modinv64_cold_20();
LAB_00145299:
      secp256k1_modinv64_cold_19();
LAB_0014529e:
      secp256k1_modinv64_cold_18();
LAB_001452a3:
      secp256k1_modinv64_cold_17();
LAB_001452a8:
      secp256k1_modinv64_cold_16();
LAB_001452ad:
      secp256k1_modinv64_cold_15();
LAB_001452b2:
      secp256k1_modinv64_cold_14();
LAB_001452b7:
      secp256k1_modinv64_cold_13();
LAB_001452bc:
      secp256k1_modinv64_cold_12();
LAB_001452c1:
      psVar14 = psVar15;
      secp256k1_modinv64_cold_11();
LAB_001452c6:
      secp256k1_modinv64_cold_10();
LAB_001452cb:
      psVar15 = psVar14;
      secp256k1_modinv64_cold_9();
LAB_001452d0:
      secp256k1_modinv64_cold_8();
LAB_001452d5:
      secp256k1_modinv64_cold_23();
LAB_001452da:
      secp256k1_modinv64_cold_22();
      goto LAB_001452df;
    }
    psVar24 = (secp256k1_gej *)0x5;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar14,5,&modinfo->modulus,1);
    if (0 < iVar4) goto LAB_00145276;
    psVar15 = (secp256k1_gej *)auStack_260;
    psVar24 = (secp256k1_gej *)0x5;
    psVar14 = psVar15;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar15,5,&modinfo->modulus,-1);
    if (iVar4 < 1) goto LAB_0014527b;
    psVar24 = (secp256k1_gej *)0x5;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar15,5,&modinfo->modulus,1);
    if (-1 < iVar4) goto LAB_00145280;
    psVar24 = (secp256k1_gej *)(uVar26 * uVar6);
    lVar11 = SUB168(SEXT816((long)uVar26) * SEXT816((long)uVar6),8);
    uVar9 = uVar7 * uVar23;
    psVar15 = SUB168(SEXT816((long)uVar7) * SEXT816((long)uVar23),8);
    if ((-1 < (long)psVar15) &&
       (uVar8 = (ulong)((secp256k1_gej *)(-1 - uVar9) < psVar24),
       lVar13 = (0x7fffffffffffffff - (long)psVar15) - lVar11,
       (SBORROW8(0x7fffffffffffffff - (long)psVar15,lVar11) != SBORROW8(lVar13,uVar8)) !=
       (long)(lVar13 - uVar8) < 0)) goto LAB_001452d5;
    puVar18 = (uint64_t *)((long)(psVar24->x).n + uVar9);
    psVar15 = (secp256k1_gej *)((long)(psVar15->x).n + (ulong)CARRY8(uVar9,(ulong)psVar24) + lVar11)
    ;
    uVar9 = uVar25 * uVar6;
    lVar11 = SUB168(SEXT816((long)uVar25) * SEXT816((long)uVar6),8);
    psVar24 = (secp256k1_gej *)((long)psStack_308 * uVar23);
    lVar13 = SUB168(SEXT816((long)psStack_308) * SEXT816((long)uVar23),8);
    if ((-1 < lVar13) &&
       (uVar6 = (ulong)(-(long)psVar24 - 1U < uVar9),
       lVar21 = (0x7fffffffffffffff - lVar13) - lVar11,
       (SBORROW8(0x7fffffffffffffff - lVar13,lVar11) != SBORROW8(lVar21,uVar6)) !=
       (long)(lVar21 - uVar6) < 0)) goto LAB_001452da;
    bVar28 = CARRY8((ulong)psVar24,uVar9);
    psVar24 = (secp256k1_gej *)((long)(psVar24->x).n + uVar9);
    lVar11 = lVar13 + lVar11 + (ulong)bVar28;
    if (((ulong)puVar18 & 0x3ffffffffffffffe) != 0) goto LAB_00145285;
    if (((ulong)psVar24 & 0x3fffffffffffffff) != 0) goto LAB_0014528a;
    uVar6 = (ulong)puVar18 >> 0x3e | (long)psVar15 * 4;
    uVar23 = uStack_2c8 * uVar26 + uVar6;
    lVar13 = SUB168(SEXT816((long)uStack_2c8) * SEXT816((long)uVar26),8) + ((long)psVar15 >> 0x3e) +
             (ulong)CARRY8(uStack_2c8 * uVar26,uVar6);
    uVar6 = uStack_2c0 * uVar7;
    psVar15 = SUB168(SEXT816((long)uStack_2c0) * SEXT816((long)uVar7),8);
    if (-1 < (long)psVar15) {
      uVar9 = (ulong)(-uVar6 - 1 < uVar23);
      lVar21 = (0x7fffffffffffffff - (long)psVar15) - lVar13;
      if ((SBORROW8(0x7fffffffffffffff - (long)psVar15,lVar13) != SBORROW8(lVar21,uVar9)) ==
          (long)(lVar21 - uVar9) < 0) goto LAB_00144c34;
      goto LAB_0014528f;
    }
    lVar20 = (-0x8000000000000000 - (long)psVar15) - (ulong)(uVar6 != 0);
    lVar21 = lVar13 - lVar20;
    if ((SBORROW8(lVar13,lVar20) != SBORROW8(lVar21,(ulong)(uVar23 < -uVar6))) !=
        (long)(lVar21 - (ulong)(uVar23 < -uVar6)) < 0) goto LAB_0014528f;
LAB_00144c34:
    uVar9 = (ulong)psVar24 >> 0x3e | lVar11 * 4;
    psVar15 = (secp256k1_gej *)((long)(psVar15->x).n + (ulong)CARRY8(uVar6,uVar23) + lVar13);
    uVar8 = uStack_2c8 * uVar25 + uVar9;
    lVar11 = SUB168(SEXT816((long)uStack_2c8) * SEXT816((long)uVar25),8) + (lVar11 >> 0x3e) +
             (ulong)CARRY8(uStack_2c8 * uVar25,uVar9);
    uVar9 = uStack_2c0 * (long)psStack_308;
    psVar24 = SUB168(SEXT816((long)uStack_2c0) * SEXT816((long)psStack_308),8);
    if (-1 < (long)psVar24) {
      uVar12 = (ulong)(-uVar9 - 1 < uVar8);
      lVar13 = (0x7fffffffffffffff - (long)psVar24) - lVar11;
      if ((SBORROW8(0x7fffffffffffffff - (long)psVar24,lVar11) != SBORROW8(lVar13,uVar12)) ==
          (long)(lVar13 - uVar12) < 0) goto LAB_00144cb4;
      goto LAB_00145294;
    }
    lVar21 = (-0x8000000000000000 - (long)psVar24) - (ulong)(uVar9 != 0);
    lVar13 = lVar11 - lVar21;
    if ((SBORROW8(lVar11,lVar21) != SBORROW8(lVar13,(ulong)(uVar8 < -uVar9))) !=
        (long)(lVar13 - (ulong)(uVar8 < -uVar9)) < 0) goto LAB_00145294;
LAB_00144cb4:
    psVar24 = (secp256k1_gej *)((long)(psVar24->x).n + (ulong)CARRY8(uVar9,uVar8) + lVar11);
    uVar12 = (long)psVar15 * 4 | uVar6 + uVar23 >> 0x3e;
    uVar6 = uVar6 + uVar23 & 0x3fffffffffffffff;
    uStack_280 = uVar9 + uVar8 & 0x3fffffffffffffff;
    psVar14 = (secp256k1_gej *)(uStack_2e0 * uVar26 + uVar12);
    lVar11 = SUB168(SEXT816((long)uStack_2e0) * SEXT816((long)uVar26),8) + ((long)psVar15 >> 0x3e) +
             (ulong)CARRY8(uStack_2e0 * uVar26,uVar12);
    uVar23 = uStack_2d0 * uVar7;
    lVar13 = SUB168(SEXT816((long)uStack_2d0) * SEXT816((long)uVar7),8);
    auStack_2b0._0_8_ = uVar6;
    auStack_260._0_8_ = uStack_280;
    if (-1 < lVar13) {
      psVar15 = (secp256k1_gej *)(-1 - uVar23);
      lVar21 = (0x7fffffffffffffff - lVar13) - lVar11;
      if ((SBORROW8(0x7fffffffffffffff - lVar13,lVar11) !=
          SBORROW8(lVar21,(ulong)(psVar15 < psVar14))) ==
          (long)(lVar21 - (ulong)(psVar15 < psVar14)) < 0) goto LAB_00144d6a;
      goto LAB_00145299;
    }
    lVar20 = (-0x8000000000000000 - lVar13) - (ulong)(uVar23 != 0);
    lVar21 = lVar11 - lVar20;
    psVar15 = (secp256k1_gej *)(lVar21 - (ulong)(psVar14 < (secp256k1_gej *)-uVar23));
    if ((SBORROW8(lVar11,lVar20) != SBORROW8(lVar21,(ulong)(psVar14 < (secp256k1_gej *)-uVar23))) !=
        (long)psVar15 < 0) goto LAB_00145299;
LAB_00144d6a:
    uVar9 = uVar9 + uVar8 >> 0x3e | (long)psVar24 * 4;
    puVar18 = (uint64_t *)((long)(psVar14->x).n + uVar23);
    lVar11 = lVar11 + lVar13 + (ulong)CARRY8((ulong)psVar14,uVar23);
    psVar14 = (secp256k1_gej *)(uStack_2e0 * uVar25 + uVar9);
    psVar15 = (secp256k1_gej *)
              (SUB168(SEXT816((long)uStack_2e0) * SEXT816((long)uVar25),8) + ((long)psVar24 >> 0x3e)
              + (ulong)CARRY8(uStack_2e0 * uVar25,uVar9));
    uVar23 = uStack_2d0 * (long)psStack_308;
    lVar13 = SUB168(SEXT816((long)uStack_2d0) * SEXT816((long)psStack_308),8);
    if (-1 < lVar13) {
      psVar24 = (secp256k1_gej *)(-1 - uVar23);
      lVar21 = (0x7fffffffffffffff - lVar13) - (long)psVar15;
      if ((SBORROW8(0x7fffffffffffffff - lVar13,(long)psVar15) !=
          SBORROW8(lVar21,(ulong)(psVar24 < psVar14))) ==
          (long)(lVar21 - (ulong)(psVar24 < psVar14)) < 0) goto LAB_00144dd9;
      goto LAB_0014529e;
    }
    lVar20 = (-0x8000000000000000 - lVar13) - (ulong)(uVar23 != 0);
    lVar21 = (long)psVar15 - lVar20;
    psVar24 = (secp256k1_gej *)(lVar21 - (ulong)(psVar14 < (secp256k1_gej *)-uVar23));
    if ((SBORROW8((long)psVar15,lVar20) !=
        SBORROW8(lVar21,(ulong)(psVar14 < (secp256k1_gej *)-uVar23))) != (long)psVar24 < 0)
    goto LAB_0014529e;
LAB_00144dd9:
    puVar19 = (uint64_t *)((long)(psVar14->x).n + uVar23);
    psVar15 = (secp256k1_gej *)
              ((long)(psVar15->x).n + (ulong)CARRY8((ulong)psVar14,uVar23) + lVar13);
    uVar23 = lVar11 * 4 | (ulong)puVar18 >> 0x3e;
    uStack_2c8 = (ulong)puVar18 & 0x3fffffffffffffff;
    uStack_2c0 = (ulong)puVar19 & 0x3fffffffffffffff;
    uVar9 = uVar17 * uVar26 + uVar23;
    psVar24 = (secp256k1_gej *)
              (SUB168(SEXT816((long)uVar17) * SEXT816((long)uVar26),8) + (lVar11 >> 0x3e) +
              (ulong)CARRY8(uVar17 * uVar26,uVar23));
    uVar23 = uStack_2e8 * uVar7;
    lVar11 = SUB168(SEXT816((long)uStack_2e8) * SEXT816((long)uVar7),8);
    auStack_2b0._8_8_ = uStack_2c8;
    auStack_260._8_8_ = uStack_2c0;
    if (-1 < lVar11) {
      uVar8 = (ulong)(-uVar23 - 1 < uVar9);
      lVar13 = (0x7fffffffffffffff - lVar11) - (long)psVar24;
      if ((SBORROW8(0x7fffffffffffffff - lVar11,(long)psVar24) != SBORROW8(lVar13,uVar8)) ==
          (long)(lVar13 - uVar8) < 0) goto LAB_00144e6b;
      goto LAB_001452a3;
    }
    lVar21 = (-0x8000000000000000 - lVar11) - (ulong)(uVar23 != 0);
    lVar13 = (long)psVar24 - lVar21;
    if ((SBORROW8((long)psVar24,lVar21) != SBORROW8(lVar13,(ulong)(uVar9 < -uVar23))) !=
        (long)(lVar13 - (ulong)(uVar9 < -uVar23)) < 0) goto LAB_001452a3;
LAB_00144e6b:
    uVar8 = (ulong)puVar19 >> 0x3e | (long)psVar15 * 4;
    psVar24 = (secp256k1_gej *)((long)(psVar24->x).n + (ulong)CARRY8(uVar9,uVar23) + lVar11);
    psVar14 = (secp256k1_gej *)(uVar17 * uVar25 + uVar8);
    lVar11 = SUB168(SEXT816((long)uVar17) * SEXT816((long)uVar25),8) + ((long)psVar15 >> 0x3e) +
             (ulong)CARRY8(uVar17 * uVar25,uVar8);
    uVar17 = uStack_2e8 * (long)psStack_308;
    lVar13 = SUB168(SEXT816((long)uStack_2e8) * SEXT816((long)psStack_308),8);
    if (-1 < lVar13) {
      psVar15 = (secp256k1_gej *)(-1 - uVar17);
      lVar21 = (0x7fffffffffffffff - lVar13) - lVar11;
      if ((SBORROW8(0x7fffffffffffffff - lVar13,lVar11) !=
          SBORROW8(lVar21,(ulong)(psVar15 < psVar14))) ==
          (long)(lVar21 - (ulong)(psVar15 < psVar14)) < 0) goto LAB_00144ee3;
      goto LAB_001452a8;
    }
    lVar20 = (-0x8000000000000000 - lVar13) - (ulong)(uVar17 != 0);
    lVar21 = lVar11 - lVar20;
    psVar15 = (secp256k1_gej *)(lVar21 - (ulong)(psVar14 < (secp256k1_gej *)-uVar17));
    if ((SBORROW8(lVar11,lVar20) != SBORROW8(lVar21,(ulong)(psVar14 < (secp256k1_gej *)-uVar17))) !=
        (long)psVar15 < 0) goto LAB_001452a8;
LAB_00144ee3:
    puVar18 = (uint64_t *)((long)(psVar14->x).n + uVar17);
    lVar11 = lVar11 + lVar13 + (ulong)CARRY8((ulong)psVar14,uVar17);
    uVar17 = (long)psVar24 * 4 | uVar9 + uVar23 >> 0x3e;
    uStack_2e0 = uVar9 + uVar23 & 0x3fffffffffffffff;
    uStack_2d0 = (ulong)puVar18 & 0x3fffffffffffffff;
    psVar14 = (secp256k1_gej *)(uStack_2f8 * uVar26 + uVar17);
    psVar15 = (secp256k1_gej *)
              (SUB168(SEXT816((long)uStack_2f8) * SEXT816((long)uVar26),8) + ((long)psVar24 >> 0x3e)
              + (ulong)CARRY8(uStack_2f8 * uVar26,uVar17));
    uVar17 = uStack_2f0 * uVar7;
    lVar13 = SUB168(SEXT816((long)uStack_2f0) * SEXT816((long)uVar7),8);
    if (lVar13 < 0) {
      lVar20 = (-0x8000000000000000 - lVar13) - (ulong)(uVar17 != 0);
      lVar21 = (long)psVar15 - lVar20;
      bVar28 = SBORROW8((long)psVar15,lVar20) !=
               SBORROW8(lVar21,(ulong)(psVar14 < (secp256k1_gej *)-uVar17));
      psVar24 = (secp256k1_gej *)(lVar21 - (ulong)(psVar14 < (secp256k1_gej *)-uVar17));
      psVar16 = psVar24;
    }
    else {
      psVar24 = (secp256k1_gej *)(-1 - uVar17);
      lVar21 = (0x7fffffffffffffff - lVar13) - (long)psVar15;
      bVar28 = SBORROW8(0x7fffffffffffffff - lVar13,(long)psVar15) !=
               SBORROW8(lVar21,(ulong)(psVar24 < psVar14));
      psVar16 = (secp256k1_gej *)(lVar21 - (ulong)(psVar24 < psVar14));
    }
    auStack_2b0._16_8_ = uStack_2e0;
    auStack_260._16_8_ = uStack_2d0;
    if (bVar28 != (long)psVar16 < 0) goto LAB_001452ad;
    uVar7 = (ulong)puVar18 >> 0x3e | lVar11 * 4;
    puVar18 = (uint64_t *)((long)(psVar14->x).n + uVar17);
    psVar15 = (secp256k1_gej *)
              ((long)(psVar15->x).n + (ulong)CARRY8((ulong)psVar14,uVar17) + lVar13);
    uVar23 = uStack_2f8 * uVar25 + uVar7;
    psVar24 = (secp256k1_gej *)
              (SUB168(SEXT816((long)uStack_2f8) * SEXT816((long)uVar25),8) + (lVar11 >> 0x3e) +
              (ulong)CARRY8(uStack_2f8 * uVar25,uVar7));
    uVar7 = uStack_2f0 * (long)psStack_308;
    lVar11 = SUB168(SEXT816((long)uStack_2f0) * SEXT816((long)psStack_308),8);
    if (-1 < lVar11) {
      uVar17 = (ulong)(-uVar7 - 1 < uVar23);
      lVar13 = (0x7fffffffffffffff - lVar11) - (long)psVar24;
      if ((SBORROW8(0x7fffffffffffffff - lVar11,(long)psVar24) != SBORROW8(lVar13,uVar17)) ==
          (long)(lVar13 - uVar17) < 0) goto LAB_0014502b;
      goto LAB_001452b2;
    }
    lVar21 = (-0x8000000000000000 - lVar11) - (ulong)(uVar7 != 0);
    lVar13 = (long)psVar24 - lVar21;
    if ((SBORROW8((long)psVar24,lVar21) != SBORROW8(lVar13,(ulong)(uVar23 < -uVar7))) !=
        (long)(lVar13 - (ulong)(uVar23 < -uVar7)) < 0) goto LAB_001452b2;
LAB_0014502b:
    psVar14 = (secp256k1_gej *)auStack_2b0;
    psVar24 = (secp256k1_gej *)((long)(psVar24->x).n + (ulong)CARRY8(uVar23,uVar7) + lVar11);
    uStack_2f8 = (long)psVar15 * 4 | (ulong)puVar18 >> 0x3e;
    uVar17 = (ulong)puVar18 & 0x3fffffffffffffff;
    uStack_2e8 = uVar23 + uVar7 & 0x3fffffffffffffff;
    psVar15 = (secp256k1_gej *)
              (((long)psVar15 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uStack_2f8));
    auStack_2b0._24_8_ = uVar17;
    auStack_260._24_8_ = uStack_2e8;
    if (psVar15 != (secp256k1_gej *)0xffffffffffffffff) goto LAB_001452b7;
    uStack_2f0 = uVar23 + uVar7 >> 0x3e | (long)psVar24 * 4;
    psVar24 = (secp256k1_gej *)
              (((long)psVar24 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uStack_2f0));
    auStack_2b0._32_8_ = uStack_2f8;
    if (psVar24 != (secp256k1_gej *)0xffffffffffffffff) goto LAB_001452bc;
    psVar24 = (secp256k1_gej *)0x5;
    psVar15 = psVar14;
    auStack_260._32_8_ = uStack_2f0;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar14,5,&modinfo->modulus,-1);
    if (iVar4 < 1) goto LAB_001452c1;
    psVar24 = (secp256k1_gej *)0x5;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar14,5,&modinfo->modulus,1);
    if (0 < iVar4) goto LAB_001452c6;
    psVar15 = (secp256k1_gej *)auStack_260;
    psVar24 = (secp256k1_gej *)0x5;
    psVar14 = psVar15;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar15,5,&modinfo->modulus,-1);
    if (iVar4 < 1) goto LAB_001452cb;
    psVar24 = (secp256k1_gej *)0x5;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar15,5,&modinfo->modulus,1);
    if (-1 < iVar4) goto LAB_001452d0;
    uVar5 = (int)uStack_278 + 1;
    uVar9 = (ulong)uVar5;
    uVar23 = uStack_280;
  } while (uVar5 != 10);
  psVar15 = (secp256k1_gej *)auStack_260;
  psVar24 = (secp256k1_gej *)0x5;
  iVar4 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)psVar15,5,&SECP256K1_SIGNED62_ONE,0);
  if (iVar4 == 0) {
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)auStack_2b0,5,&SECP256K1_SIGNED62_ONE,-1);
    a_00 = auStack_2b0._40_8_;
    if ((iVar4 == 0) ||
       (iVar4 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)auStack_2b0,5,&SECP256K1_SIGNED62_ONE,1),
       iVar4 == 0)) {
LAB_0014521b:
      secp256k1_modinv64_normalize_62((secp256k1_modinv64_signed62 *)auStack_210,uStack_2f8,modinfo)
      ;
      ((secp256k1_fe *)a_00)->n[4] = auStack_210._32_8_;
      ((secp256k1_fe *)a_00)->n[2] = auStack_210._16_8_;
      ((secp256k1_fe *)a_00)->n[3] = auStack_210._24_8_;
      ((secp256k1_fe *)a_00)->n[0] = auStack_210._0_8_;
      ((secp256k1_fe *)a_00)->n[1] = auStack_210._8_8_;
      return;
    }
    psVar24 = (secp256k1_gej *)0x5;
    psVar15 = (secp256k1_gej *)a_00;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)a_00,5,&SECP256K1_SIGNED62_ONE,0);
    if (iVar4 == 0) {
      psVar15 = (secp256k1_gej *)auStack_210;
      psVar24 = (secp256k1_gej *)0x5;
      iVar4 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar15,5,&SECP256K1_SIGNED62_ONE,0);
      if (iVar4 == 0) {
        psVar15 = (secp256k1_gej *)auStack_2b0;
        psVar24 = (secp256k1_gej *)0x5;
        iVar4 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)psVar15,5,&modinfo->modulus,1);
        if (iVar4 == 0) goto LAB_0014521b;
      }
    }
  }
  else {
LAB_001452df:
    secp256k1_modinv64_cold_6();
  }
  secp256k1_modinv64_cold_7();
LAB_001452e9:
  secp256k1_modinv64_cold_3();
  uVar23 = (ulong)((uint)(psVar24->x).n[0] & 1);
  uVar10 = -uVar23;
  secp256k1_scalar_verify((secp256k1_scalar *)psVar24);
  uVar7 = (psVar24->x).n[1] << 0x3f | (psVar24->x).n[0] >> 1;
  (psVar15->x).n[0] = uVar7 + (uVar10 & 0xdfe92f46681b20a1);
  uVar17 = (psVar24->x).n[2] << 0x3f | (psVar24->x).n[1] >> 1;
  uVar7 = (ulong)CARRY8(uVar10 & 0xdfe92f46681b20a1,uVar7);
  uVar6 = (uVar10 & 0x5d576e7357a4501d) + uVar17;
  bVar28 = CARRY8(uVar10 & 0x5d576e7357a4501d,uVar17) || CARRY8(uVar6,uVar7);
  (psVar15->x).n[1] = uVar6 + uVar7;
  uVar7 = (psVar24->x).n[3] << 0x3f | (psVar24->x).n[2] >> 1;
  (psVar15->x).n[2] = (uVar7 - uVar23) + (ulong)bVar28;
  (psVar15->x).n[3] =
       (uVar10 & 0x7fffffffffffffff) + ((psVar24->x).n[3] >> 1) +
       (ulong)(CARRY8(uVar7,uVar10) || CARRY8(uVar7 + uVar10,(ulong)bVar28));
  secp256k1_scalar_verify((secp256k1_scalar *)psVar15);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_cmov(secp256k1_fe *r, const secp256k1_fe *a, int flag) {
    VERIFY_CHECK(flag == 0 || flag == 1);
    SECP256K1_FE_VERIFY(a);
    SECP256K1_FE_VERIFY(r);

    secp256k1_fe_impl_cmov(r, a, flag);
    if (a->magnitude > r->magnitude) r->magnitude = a->magnitude;
    if (!a->normalized) r->normalized = 0;

    SECP256K1_FE_VERIFY(r);
}